

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O2

void ncnn::dynamic_quantize_2d_per_h(Mat *blob,Mat *blob_int8,Mat *scales,Option *opt)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  void *pvVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int j;
  ulong uVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  
  Mat::create(blob_int8,blob->w,blob->h,1,1,opt->workspace_allocator);
  Mat::create(scales,blob->h,4,1,opt->workspace_allocator);
  uVar5 = blob_int8->w;
  uVar7 = blob_int8->h;
  pvVar8 = blob->data;
  iVar1 = blob->w;
  pvVar2 = scales->data;
  uVar10 = 0;
  uVar12 = 0;
  if (0 < (int)uVar5) {
    uVar12 = (ulong)uVar5;
  }
  uVar13 = 0;
  if (0 < (int)uVar7) {
    uVar13 = (ulong)uVar7;
  }
  sVar3 = blob->elemsize;
  for (; uVar10 != uVar13; uVar10 = uVar10 + 1) {
    fVar16 = 0.0;
    for (uVar14 = 0; uVar12 != uVar14; uVar14 = uVar14 + 1) {
      fVar17 = ABS(*(float *)((long)pvVar8 + uVar14 * 4));
      if (fVar16 <= fVar17) {
        fVar16 = fVar17;
      }
    }
    *(uint *)((long)pvVar2 + uVar10 * 4) =
         -(uint)(fVar16 == 0.0) & 0x3f800000 | ~-(uint)(fVar16 == 0.0) & (uint)(127.0 / fVar16);
    pvVar8 = (void *)((long)pvVar8 + (long)iVar1 * sVar3);
  }
  for (lVar11 = 0; lVar11 < (int)uVar7; lVar11 = lVar11 + 1) {
    iVar1 = blob->w;
    lVar9 = (long)(int)uVar5;
    fVar16 = *(float *)((long)scales->data + lVar11 * 4);
    sVar3 = blob_int8->elemsize;
    pvVar8 = blob_int8->data;
    sVar4 = blob->elemsize;
    pvVar2 = blob->data;
    for (lVar15 = 0; lVar15 < (int)uVar5; lVar15 = lVar15 + 1) {
      fVar17 = roundf(*(float *)((long)pvVar2 + lVar15 * 4 + sVar4 * lVar11 * (long)iVar1) * fVar16)
      ;
      iVar6 = (int)fVar17;
      if (iVar6 < -0x7e) {
        iVar6 = -0x7f;
      }
      if (0x7e < iVar6) {
        iVar6 = 0x7f;
      }
      *(char *)((long)pvVar8 + lVar15 + sVar3 * lVar11 * lVar9) = (char)iVar6;
      uVar5 = blob_int8->w;
    }
    uVar7 = blob_int8->h;
  }
  return;
}

Assistant:

static void dynamic_quantize_2d_per_h(const Mat& blob, Mat& blob_int8, Mat& scales, const Option& opt)
{
    blob_int8.create(blob.w, blob.h, (size_t)1u, 1, opt.workspace_allocator);
    scales.create(blob.h, (size_t)4u, 1, opt.workspace_allocator);

    for (int i = 0; i < blob_int8.h; i++)
    {
        const float* ptr = blob.row(i);

        float absmax = 0.f;
        for (int j = 0; j < blob_int8.w; j++)
        {
            absmax = std::max(absmax, (float)fabs(ptr[j]));
        }

        scales[i] = absmax == 0.f ? 1.f : 127.f / absmax;
    }

    for (int i = 0; i < blob_int8.h; i++)
    {
        const float* ptr = blob.row(i);
        signed char* outptr = blob_int8.row<signed char>(i);
        const float scale = scales[i];

        for (int j = 0; j < blob_int8.w; j++)
        {
            outptr[j] = float2int8(ptr[j] * scale);
        }
    }
}